

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O0

void __thiscall DIS::IntercomSignalPdu::IntercomSignalPdu(IntercomSignalPdu *this)

{
  IntercomSignalPdu *this_local;
  
  RadioCommunicationsFamilyPdu::RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IntercomSignalPdu_002724c0;
  EntityID::EntityID(&this->_entityID);
  this->_communicationsDeviceID = 0;
  this->_encodingScheme = 0;
  this->_tdlType = 0;
  this->_sampleRate = 0;
  this->_dataLength = 0;
  this->_samples = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data);
  Pdu::setPduType((Pdu *)this,'\x1f');
  return;
}

Assistant:

IntercomSignalPdu::IntercomSignalPdu()
    : RadioCommunicationsFamilyPdu(), _entityID(), _communicationsDeviceID(0),
      _encodingScheme(0), _tdlType(0), _sampleRate(0), _dataLength(0),
      _samples(0) {
  setPduType(31);
}